

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cjson_add.c
# Opt level: O1

void cjson_add_bool_should_fail_on_allocation_failure(void)

{
  cJSON *object;
  cJSON *pcVar1;
  
  object = (cJSON *)(*global_hooks.allocate)(0x40);
  if (object != (cJSON *)0x0) {
    object->child = (cJSON *)0x0;
    *(undefined8 *)&object->type = 0;
    object->valuedouble = 0.0;
    object->string = (char *)0x0;
    object->valuestring = (char *)0x0;
    *(undefined8 *)&object->valueint = 0;
    object->next = (cJSON *)0x0;
    object->prev = (cJSON *)0x0;
    object->type = 0x40;
  }
  global_hooks.allocate = failing_malloc;
  global_hooks.deallocate = normal_free;
  global_hooks.reallocate = (_func_void_ptr_void_ptr_size_t *)0x0;
  pcVar1 = cJSON_AddBoolToObject(object,"false",0);
  if (pcVar1 != (cJSON *)0x0) {
    UnityFail(" Expected NULL",0xeb);
  }
  global_hooks.allocate = malloc;
  global_hooks.deallocate = free;
  global_hooks.reallocate = realloc;
  cJSON_Delete(object);
  return;
}

Assistant:

static void cjson_add_bool_should_fail_on_allocation_failure(void)
{
    cJSON *root = cJSON_CreateObject();

    cJSON_InitHooks(&failing_hooks);

    TEST_ASSERT_NULL(cJSON_AddBoolToObject(root, "false", false));

    cJSON_InitHooks(NULL);

    cJSON_Delete(root);
}